

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_rectangle_rounded_lines
               (rf_rec rec,float roundness,int segments,int line_thick,rf_color color)

{
  float fVar1;
  float fVar2;
  rf_render_batch *prVar3;
  rf_vertex_buffer *prVar4;
  uchar w;
  int iVar5;
  uchar z;
  int iVar6;
  rf_int k_1;
  ulong uVar7;
  long lVar8;
  uchar y;
  uchar x;
  rf_int k;
  long lVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float __x;
  float fVar17;
  float fVar18;
  float fVar19;
  rf_rec rec_00;
  rf_vec2 point [16];
  rf_vec2 centers [4];
  float local_140;
  float local_d8 [4];
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68 [10];
  ulong local_40;
  long local_38;
  
  local_98 = rec.width;
  local_84 = rec.height;
  local_78 = rec.x;
  local_a4 = rec.y;
  iVar10 = 0;
  if (0 < line_thick) {
    iVar10 = line_thick;
  }
  if (0.0 < roundness) {
    fVar18 = 1.0;
    if (roundness <= 1.0) {
      fVar18 = roundness;
    }
    fVar11 = local_84;
    if (local_98 <= local_84) {
      fVar11 = local_98;
    }
    fVar18 = fVar11 * fVar18 * 0.5;
    if (0.0 < fVar18) {
      uVar7 = (ulong)(uint)segments;
      if (segments < 4) {
        fVar11 = 1.0 - 0.5 / fVar18;
        fVar11 = fVar11 * fVar11;
        fVar11 = acosf(fVar11 + fVar11 + -1.0);
        fVar11 = ceilf(6.2831855 / fVar11);
        uVar7 = 4;
        if (0 < (int)(fVar11 * 0.5)) {
          uVar7 = (ulong)(uint)(int)(fVar11 * 0.5);
        }
      }
      iVar6 = (int)uVar7;
      local_b8 = (float)iVar10;
      fVar11 = fVar18 + local_b8;
      fVar12 = local_78 + fVar18;
      fVar17 = local_a4 - local_b8;
      local_98 = local_98 + local_78;
      fVar19 = local_98 - fVar18;
      local_d8[0] = local_98 + local_b8;
      local_d8[1] = local_a4 + fVar18;
      local_84 = local_a4 + local_84;
      local_d8[3] = local_84 - fVar18;
      local_c4 = local_84 + local_b8;
      local_b8 = local_78 - local_b8;
      prVar3 = (rf__ctx->field_0).current_batch;
      lVar9 = prVar3->current_buffer;
      prVar4 = prVar3->vertex_buffers;
      iVar10 = prVar4[lVar9].v_counter;
      iVar5 = prVar4[lVar9].elements_count * 4;
      z = color.b;
      y = color.g;
      x = color.r;
      local_140._0_1_ = color.a;
      w = local_140._0_1_;
      local_d8[2] = local_d8[0];
      local_c8 = fVar19;
      local_c0 = fVar12;
      local_bc = local_c4;
      local_b4 = local_d8[3];
      local_b0 = local_b8;
      local_ac = local_d8[1];
      local_a8 = fVar12;
      local_a0 = fVar19;
      local_9c = local_a4;
      local_94 = local_d8[1];
      local_90 = local_98;
      local_8c = local_d8[3];
      local_88 = fVar19;
      local_80 = fVar12;
      local_7c = local_84;
      local_74 = local_d8[3];
      local_70 = local_78;
      local_6c = local_d8[1];
      local_68[0] = fVar12;
      local_68[1] = local_d8[1];
      local_68[2] = fVar19;
      local_68[3] = local_d8[1];
      local_68[4] = fVar19;
      local_68[5] = local_d8[3];
      local_68[6] = fVar12;
      local_68[7] = local_d8[3];
      local_40 = uVar7;
      if (line_thick < 2) {
        if (iVar5 <= iVar10 + iVar6 * 8 + 8) {
          rf_gfx_draw();
        }
        rf_gfx_begin(RF_LINES);
        lVar9 = 0;
        do {
          if (0 < (int)local_40) {
            fVar18 = local_68[lVar9 * 2];
            fVar12 = local_68[lVar9 * 2 + 1];
            local_140 = (float)(&DAT_0017c400)[lVar9];
            lVar8 = (long)iVar6;
            do {
              rf_gfx_color4ub(x,y,z,w);
              fVar17 = sinf(local_140 * 0.017453292);
              fVar19 = cosf(local_140 * 0.017453292);
              rf_gfx_vertex3f(fVar17 * fVar11 + fVar18,fVar19 * fVar11 + fVar12,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              local_140 = local_140 + 90.0 / (float)iVar6;
              fVar17 = sinf(local_140 * 0.017453292);
              fVar19 = cosf(local_140 * 0.017453292);
              rf_gfx_vertex3f(fVar17 * fVar11 + fVar18,fVar19 * fVar11 + fVar12,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        uVar7 = 0xfffffffffffffffe;
        do {
          rf_gfx_color4ub(x,y,z,w);
          rf_gfx_vertex3f(local_d8[uVar7 * 2],local_d8[uVar7 * 2 + 1],
                          ((rf__ctx->field_0).current_batch)->current_depth);
          rf_gfx_vertex3f(local_d8[uVar7 * 2 + 2],local_d8[uVar7 * 2 + 3],
                          ((rf__ctx->field_0).current_batch)->current_depth);
          uVar7 = uVar7 + 2;
        } while (uVar7 < 6);
      }
      else {
        if (iVar5 <= iVar10 + iVar6 * 0x18 + 0x18) {
          rf_gfx_draw();
        }
        rf_gfx_begin(RF_TRIANGLES);
        local_38 = (long)iVar6;
        lVar9 = 0;
        do {
          if (0 < (int)uVar7) {
            fVar1 = local_68[lVar9 * 2];
            fVar2 = local_68[lVar9 * 2 + 1];
            fVar15 = (float)(&DAT_0017c400)[lVar9];
            lVar8 = local_38;
            do {
              rf_gfx_color4ub(x,y,z,local_140._0_1_);
              __x = fVar15 * 0.017453292;
              fVar13 = sinf(__x);
              fVar14 = cosf(__x);
              rf_gfx_vertex3f(fVar13 * fVar18 + fVar1,fVar14 * fVar18 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar13 = sinf(__x);
              fVar14 = cosf(__x);
              rf_gfx_vertex3f(fVar13 * fVar11 + fVar1,fVar14 * fVar11 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar15 = fVar15 + 90.0 / (float)iVar6;
              fVar13 = fVar15 * 0.017453292;
              fVar14 = sinf(fVar13);
              fVar16 = cosf(fVar13);
              rf_gfx_vertex3f(fVar14 * fVar18 + fVar1,fVar16 * fVar18 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar14 = sinf(fVar13);
              fVar16 = cosf(fVar13);
              rf_gfx_vertex3f(fVar14 * fVar18 + fVar1,fVar16 * fVar18 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar14 = sinf(__x);
              fVar16 = cosf(__x);
              rf_gfx_vertex3f(fVar14 * fVar11 + fVar1,fVar16 * fVar11 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              fVar14 = sinf(fVar13);
              fVar13 = cosf(fVar13);
              rf_gfx_vertex3f(fVar14 * fVar11 + fVar1,fVar13 * fVar11 + fVar2,
                              ((rf__ctx->field_0).current_batch)->current_depth);
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          lVar9 = lVar9 + 1;
          uVar7 = local_40;
        } while (lVar9 != 4);
        rf_gfx_color4ub(x,y,z,local_140._0_1_);
        rf_gfx_vertex3f(fVar12,fVar17,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_a8,local_a4,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_a0,local_9c,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar19,fVar17,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(fVar12,fVar17,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_a0,local_9c,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_color4ub(x,y,z,local_140._0_1_);
        rf_gfx_vertex3f(local_98,local_94,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_90,local_8c,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_d8[2],local_d8[3],((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_d8[0],local_d8[1],((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_98,local_94,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_d8[2],local_d8[3],((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_color4ub(x,y,z,local_140._0_1_);
        rf_gfx_vertex3f(local_80,local_7c,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_c0,local_bc,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_c8,local_c4,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_88,local_84,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_80,local_7c,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_c8,local_c4,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_color4ub(x,y,z,local_140._0_1_);
        rf_gfx_vertex3f(local_b0,local_ac,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_b8,local_b4,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_78,local_74,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_70,local_6c,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_b0,local_ac,((rf__ctx->field_0).current_batch)->current_depth);
        rf_gfx_vertex3f(local_78,local_74,((rf__ctx->field_0).current_batch)->current_depth);
      }
      rf_gfx_end();
    }
    return;
  }
  rec_00.x = local_78 - (float)iVar10;
  rec_00.width = local_98 + (float)(iVar10 * 2);
  rec_00.y = local_a4 - (float)iVar10;
  rec_00.height = local_84 + (float)(iVar10 * 2);
  rf_draw_rectangle_outline(rec_00,iVar10,color);
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded_lines(rf_rec rec, float roundness, int segments, int line_thick, rf_color color)
{
    if (line_thick < 0) line_thick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        rf_draw_rectangle_outline((rf_rec) {rec.x - line_thick, rec.y - line_thick, rec.width + 2 * line_thick, rec.height + 2 * line_thick}, line_thick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 2;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;
    const float outer_radius = radius + (float)line_thick, inner_radius = radius;

    /*  Quick sketch to make sense of all of this (mark the 16 + 4(corner centers P16-19) points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                     P1
     *        ====================
     *     // P8                P9 \
     *    //                        \
     *P7 // P15                  P10 \\ P2
        \\ P2
     *  ||   *P16             P17*    ||
     *  ||                            ||
     *  || P14                   P11  ||
     *P6 \\  *P19             P18*   // P3
     *    \\                        //
     *     \\ P13              P12 //
     *        ====================
     *     P5                     P4

     */
    const rf_vec2 point[16] =
            {
                    {(float)rec.x + inner_radius, rec.y - line_thick}, {(float)(rec.x + rec.width) - inner_radius, rec.y - line_thick}, { rec.x + rec.width + line_thick, (float)rec.y + inner_radius }, // PO, P1, P2
                    {rec.x + rec.width + line_thick, (float)(rec.y + rec.height) - inner_radius}, {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height + line_thick}, // P3, P4
                    {(float)rec.x + inner_radius, rec.y + rec.height + line_thick}, { rec.x - line_thick, (float)(rec.y + rec.height) - inner_radius}, {rec.x - line_thick, (float)rec.y + inner_radius}, // P5, P6, P7
                    {(float)rec.x + inner_radius, rec.y}, {(float)(rec.x + rec.width) - inner_radius, rec.y}, // P8, P9
                    { rec.x + rec.width, (float)rec.y + inner_radius }, {rec.x + rec.width, (float)(rec.y + rec.height) - inner_radius}, // P10, P11
                    {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height}, {(float)rec.x + inner_radius, rec.y + rec.height}, // P12, P13
                    { rec.x, (float)(rec.y + rec.height) - inner_radius}, {rec.x, (float)rec.y + inner_radius} // P14, P15
            };

    const rf_vec2 centers[4] =
            {
                    {(float)rec.x + inner_radius, (float)rec.y + inner_radius}, {(float)(rec.x + rec.width) - inner_radius, (float)rec.y + inner_radius}, // P16, P17
                    {(float)(rec.x + rec.width) - inner_radius, (float)(rec.y + rec.height) - inner_radius}, {(float)rec.x + inner_radius, (float)(rec.y + rec.height) - inner_radius} // P18, P19
            };

    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

    if (line_thick > 1)
    {
        if (rf_gfx_check_buffer_limit(4 * 6*segments + 4 * 6)) rf_gfx_draw(); // 4 corners with 6(2 * 3) vertices for each segment + 4 rectangles with 6 vertices each

        rf_gfx_begin(RF_TRIANGLES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

                angle += step_length;
            }
        }

        // Upper rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[8].x, point[8].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);
        rf_gfx_vertex2f(point[1].x, point[1].y);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);

        // Right rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[11].x, point[11].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);
        rf_gfx_vertex2f(point[2].x, point[2].y);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);

        // Lower rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[5].x, point[5].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);
        rf_gfx_vertex2f(point[12].x, point[12].y);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);

        // Left rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[6].x, point[6].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_vertex2f(point[15].x, point[15].y);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_end();

    }
    else
    {
        // Use LINES to draw the outline
        if (rf_gfx_check_buffer_limit(8*segments + 4 * 2)) rf_gfx_draw(); // 4 corners with 2 vertices for each segment + 4 rectangles with 2 vertices each

        rf_gfx_begin(RF_LINES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);
                angle += step_length;
            }
        }
        // And now the remaining 4 lines
        for(int i = 0; i < 8; i += 2)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(point[i].x, point[i].y);
            rf_gfx_vertex2f(point[i + 1].x, point[i + 1].y);
        }
        rf_gfx_end();
    }
}